

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O2

void __thiscall
jrtplib::RTPSources::Timeout(RTPSources *this,RTPTime *curtime,RTPTime *timeoutdelay)

{
  RTPTime *pRVar1;
  RTPInternalSourceData *obj;
  HashElement *pHVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  
  dVar7 = curtime->m_t - timeoutdelay->m_t;
  pHVar2 = (this->sourcelist).firsthashelem;
  (this->sourcelist).curhashelem = pHVar2;
  iVar4 = 0;
  iVar5 = 0;
  iVar6 = 0;
  while (pHVar2 != (HashElement *)0x0) {
    obj = pHVar2->element;
    if ((obj == this->owndata) ||
       (pRVar1 = &(obj->super_RTPSourceData).stats.lastmsgtime,
       dVar7 < pRVar1->m_t || dVar7 == pRVar1->m_t)) {
      iVar6 = iVar6 + 1;
      iVar4 = iVar4 + (uint)(obj->super_RTPSourceData).issender;
      uVar3 = (obj->super_RTPSourceData).receivedbye ^ 1;
      if ((obj->super_RTPSourceData).validated == false) {
        uVar3 = 0;
      }
      iVar5 = iVar5 + uVar3;
      pHVar2 = pHVar2->listnext;
      (this->sourcelist).curhashelem = pHVar2;
    }
    else {
      this->totalcount = this->totalcount + -1;
      if ((obj->super_RTPSourceData).issender == true) {
        this->sendercount = this->sendercount + -1;
      }
      if (((obj->super_RTPSourceData).validated == true) &&
         (((obj->super_RTPSourceData).receivedbye & 1U) == 0)) {
        this->activecount = this->activecount + -1;
      }
      RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
      ::DeleteCurrentElement(&this->sourcelist);
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[8])(this,obj);
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[7])(this,obj);
      RTPDelete<jrtplib::RTPInternalSourceData>(obj,(this->super_RTPMemoryObject).mgr);
      pHVar2 = (this->sourcelist).curhashelem;
    }
  }
  this->totalcount = iVar6;
  this->sendercount = iVar4;
  this->activecount = iVar5;
  return;
}

Assistant:

void RTPSources::Timeout(const RTPTime &curtime,const RTPTime &timeoutdelay)
{
	int newtotalcount = 0;
	int newsendercount = 0;
	int newactivecount = 0;
	RTPTime checktime = curtime;
	checktime -= timeoutdelay;
	
	sourcelist.GotoFirstElement();
	while (sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *srcdat = sourcelist.GetCurrentElement();
		RTPTime lastmsgtime = srcdat->INF_GetLastMessageTime();

		// we don't want to time out ourselves
		if ((srcdat != owndata) && (lastmsgtime < checktime)) // timeout
		{
			
			totalcount--;
			if (srcdat->IsSender())
				sendercount--;
			if (srcdat->IsActive())
				activecount--;
			
			sourcelist.DeleteCurrentElement();

			OnTimeout(srcdat);
			OnRemoveSource(srcdat);
			RTPDelete(srcdat,GetMemoryManager());
		}
		else
		{
			newtotalcount++;
			if (srcdat->IsSender())
				newsendercount++;
			if (srcdat->IsActive())
				newactivecount++;
			sourcelist.GotoNextElement();
		}
	}
	
#ifdef RTPDEBUG
	if (newtotalcount != totalcount)
	{
		std::cout << "New total count " << newtotalcount << " doesnt match old total count " << totalcount << std::endl;
		SafeCountTotal();
	}
	if (newsendercount != sendercount)
	{
		std::cout << "New sender count " << newsendercount << " doesnt match old sender count " << sendercount << std::endl;
		SafeCountSenders();
	}
	if (newactivecount != activecount)
	{
		std::cout << "New active count " << newactivecount << " doesnt match old active count " << activecount << std::endl;
		SafeCountActive();
	}
#endif // RTPDEBUG
	
	totalcount = newtotalcount; // just to play it safe
	sendercount = newsendercount;
	activecount = newactivecount;
}